

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O1

type __thiscall
llvm::yaml::yamlize<llvm::StringRef>
          (yaml *this,IO *io,StringRef *Val,bool param_3,EmptyContext *Ctx)

{
  Twine *this_00;
  undefined1 auVar1 [16];
  ScalarTraits<llvm::StringRef,_void> *this_01;
  _Alloc_hider _Var2;
  char cVar3;
  QuotingType QVar4;
  void *pvVar5;
  ulong extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar6;
  StringRef S;
  StringRef Scalar;
  ScalarTraits<llvm::StringRef,_void> *pSStack_88;
  string Storage;
  raw_string_ostream Buffer;
  StringRef Str;
  
  cVar3 = (**(code **)(*(long *)this + 0x10))();
  if (cVar3 == '\0') {
    pSStack_88 = (ScalarTraits<llvm::StringRef,_void> *)0x0;
    Storage._M_dataplus._M_p = (pointer)0x0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = extraout_RDX;
    QVar4 = needsQuotes((yaml *)0x0,(StringRef)(auVar1 << 0x40));
    (**(code **)(*(long *)this + 0xd8))(this,&pSStack_88,QVar4);
    _Var2 = Storage._M_dataplus;
    this_01 = pSStack_88;
    pvVar5 = IO::getContext((IO *)this);
    Scalar.Length = (size_t)pvVar5;
    Scalar.Data = _Var2._M_p;
    join_0x00000010_0x00000000_ =
         ScalarTraits<llvm::StringRef,_void>::input(this_01,Scalar,io,(StringRef *)Ctx);
    if (Buffer._48_8_ != 0) {
      this_00 = (Twine *)((long)&Storage.field_2 + 8);
      Twine::Twine(this_00,(StringRef *)&Buffer.OS);
      (**(code **)(*(long *)this + 0xf8))(this,this_00);
    }
  }
  else {
    Storage._M_dataplus._M_p = (pointer)0x0;
    Storage._M_string_length._0_1_ = 0;
    Buffer.super_raw_ostream.OutBufCur._0_4_ = 1;
    Buffer.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
    Buffer.super_raw_ostream.OutBufStart = (char *)0x0;
    Buffer.super_raw_ostream.OutBufEnd = (char *)0x0;
    Storage.field_2._8_8_ = &PTR__raw_string_ostream_010994b8;
    Buffer.super_raw_ostream._32_8_ = &pSStack_88;
    pSStack_88 = (ScalarTraits<llvm::StringRef,_void> *)&Storage._M_string_length;
    pvVar5 = IO::getContext((IO *)this);
    ScalarTraits<llvm::StringRef,_void>::output
              ((StringRef *)io,pvVar5,(raw_ostream *)((long)&Storage.field_2 + 8));
    sVar6 = extraout_RDX_00;
    if ((_func_int **)Buffer.super_raw_ostream.OutBufEnd !=
        Buffer.super_raw_ostream._vptr_raw_ostream) {
      raw_ostream::flush_nonempty((raw_ostream *)((long)&Storage.field_2 + 8));
      sVar6 = extraout_RDX_01;
    }
    unique0x100001d1 = *(StringRef *)Buffer.super_raw_ostream._32_8_;
    S.Length = sVar6;
    S.Data = *(char **)(Buffer.super_raw_ostream._32_8_ + 8);
    QVar4 = needsQuotes(*(yaml **)Buffer.super_raw_ostream._32_8_,S);
    (**(code **)(*(long *)this + 0xd8))(this,&Buffer.OS,QVar4);
    raw_string_ostream::~raw_string_ostream((raw_string_ostream *)((long)&Storage.field_2 + 8));
    if (pSStack_88 != (ScalarTraits<llvm::StringRef,_void> *)&Storage._M_string_length) {
      operator_delete(pSStack_88,
                      CONCAT71(Storage._M_string_length._1_7_,(undefined1)Storage._M_string_length)
                      + 1);
    }
  }
  return;
}

Assistant:

typename std::enable_if<has_ScalarTraits<T>::value, void>::type
yamlize(IO &io, T &Val, bool, EmptyContext &Ctx) {
  if ( io.outputting() ) {
    std::string Storage;
    raw_string_ostream Buffer(Storage);
    ScalarTraits<T>::output(Val, io.getContext(), Buffer);
    StringRef Str = Buffer.str();
    io.scalarString(Str, ScalarTraits<T>::mustQuote(Str));
  }
  else {
    StringRef Str;
    io.scalarString(Str, ScalarTraits<T>::mustQuote(Str));
    StringRef Result = ScalarTraits<T>::input(Str, io.getContext(), Val);
    if ( !Result.empty() ) {
      io.setError(Twine(Result));
    }
  }
}